

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewString(xmlChar *val)

{
  xmlChar *pxVar1;
  xmlXPathObjectPtr ret;
  xmlChar *val_local;
  
  val_local = (xmlChar *)(*xmlMalloc)(0x48);
  if (val_local == (xmlChar *)0x0) {
    val_local = (xmlChar *)0x0;
  }
  else {
    memset(val_local,0,0x48);
    val_local[0] = '\x04';
    val_local[1] = '\0';
    val_local[2] = '\0';
    val_local[3] = '\0';
    ret = (xmlXPathObjectPtr)val;
    if (val == (xmlChar *)0x0) {
      ret = (xmlXPathObjectPtr)0x24e92e;
    }
    pxVar1 = xmlStrdup((xmlChar *)ret);
    *(xmlChar **)(val_local + 0x20) = pxVar1;
    if (*(long *)(val_local + 0x20) == 0) {
      (*xmlFree)(val_local);
      val_local = (xmlChar *)0x0;
    }
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewString(const xmlChar *val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_STRING;
    if (val == NULL)
        val = BAD_CAST "";
    ret->stringval = xmlStrdup(val);
    if (ret->stringval == NULL) {
        xmlFree(ret);
        return(NULL);
    }
    return(ret);
}